

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O3

void plutovg_canvas_stroke_extents(plutovg_canvas_t *canvas,plutovg_rect_t *extents)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  plutovg_state_t *ppVar5;
  float fVar6;
  float fVar7;
  
  ppVar5 = canvas->state;
  fVar7 = (ppVar5->stroke).style.width * 0.5;
  fVar6 = fVar7;
  if ((ppVar5->stroke).style.join == PLUTOVG_LINE_JOIN_MITER) {
    fVar6 = (ppVar5->stroke).style.miter_limit * fVar7;
  }
  if ((ppVar5->stroke).style.cap == PLUTOVG_LINE_CAP_SQUARE) {
    fVar7 = fVar7 * 1.4142135;
  }
  if (fVar7 <= fVar6) {
    fVar7 = fVar6;
  }
  plutovg_path_extents(canvas->path,extents,true);
  uVar1 = extents->x;
  uVar3 = extents->y;
  uVar2 = extents->w;
  uVar4 = extents->h;
  extents->x = (float)uVar1 - fVar7;
  extents->y = (float)uVar3 - fVar7;
  extents->w = fVar7 + fVar7 + (float)uVar2;
  extents->h = fVar7 + fVar7 + (float)uVar4;
  plutovg_matrix_map_rect(&canvas->state->matrix,extents,extents);
  return;
}

Assistant:

void plutovg_canvas_stroke_extents(const plutovg_canvas_t* canvas, plutovg_rect_t* extents)
{
    plutovg_stroke_data_t* stroke = &canvas->state->stroke;
    float cap_limit = stroke->style.width / 2.f;
    if(stroke->style.cap == PLUTOVG_LINE_CAP_SQUARE)
        cap_limit *= PLUTOVG_SQRT2;
    float join_limit = stroke->style.width / 2.f;
    if(stroke->style.join == PLUTOVG_LINE_JOIN_MITER) {
        join_limit *= stroke->style.miter_limit;
    }

    float delta = plutovg_max(cap_limit, join_limit);
    plutovg_path_extents(canvas->path, extents, true);
    extents->x -= delta;
    extents->y -= delta;
    extents->w += delta * 2.f;
    extents->h += delta * 2.f;
    plutovg_canvas_map_rect(canvas, extents, extents);
}